

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

int32_t icu_63::calcAlgNameSetsLengths(int32_t maxNameLength)

{
  byte bVar1;
  int iVar2;
  int32_t iVar3;
  int *piVar4;
  int local_4c;
  int32_t maxFactorLength;
  int32_t factorLength;
  int32_t factor;
  int32_t count;
  int32_t i;
  char *s;
  uint16_t *factors;
  int32_t length;
  uint32_t rangeCount;
  uint32_t *p;
  AlgorithmicRange *range;
  int32_t maxNameLength_local;
  
  piVar4 = (int *)(uCharNames + (ulong)*(uint *)(uCharNames + 0xc));
  p = (uint32_t *)(piVar4 + 1);
  range._4_4_ = maxNameLength;
  for (factors._4_4_ = *piVar4; factors._4_4_ != 0; factors._4_4_ = factors._4_4_ + -1) {
    if ((char)p[2] == '\0') {
      iVar3 = calcStringSetLength((uint32_t *)gNameSet,(char *)(p + 3));
      iVar2 = iVar3 + (uint)*(byte *)((long)p + 9);
      if (range._4_4_ < iVar2) {
        range._4_4_ = iVar2;
      }
    }
    else if ((char)p[2] == '\x01') {
      bVar1 = *(byte *)((long)p + 9);
      _count = (char *)((long)p + (long)(int)(uint)bVar1 * 2 + 0xc);
      factors._0_4_ = calcStringSetLength((uint32_t *)gNameSet,_count);
      _count = _count + ((int32_t)factors + 1);
      for (factor = 0; factor < (int)(uint)bVar1; factor = factor + 1) {
        local_4c = 0;
        for (maxFactorLength = (int32_t)*(ushort *)((long)p + (long)factor * 2 + 0xc);
            0 < maxFactorLength; maxFactorLength = maxFactorLength + -1) {
          iVar3 = calcStringSetLength((uint32_t *)gNameSet,_count);
          _count = _count + (iVar3 + 1);
          if (local_4c < iVar3) {
            local_4c = iVar3;
          }
        }
        factors._0_4_ = local_4c + (int32_t)factors;
      }
      if (range._4_4_ < (int32_t)factors) {
        range._4_4_ = (int32_t)factors;
      }
    }
    p = (uint32_t *)((long)p + (long)(int)(uint)*(ushort *)((long)p + 10));
  }
  return range._4_4_;
}

Assistant:

static int32_t
calcAlgNameSetsLengths(int32_t maxNameLength) {
    AlgorithmicRange *range;
    uint32_t *p;
    uint32_t rangeCount;
    int32_t length;

    /* enumerate algorithmic ranges */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    rangeCount=*p;
    range=(AlgorithmicRange *)(p+1);
    while(rangeCount>0) {
        switch(range->type) {
        case 0:
            /* name = prefix + (range->variant times) hex-digits */
            /* prefix */
            length=calcStringSetLength(gNameSet, (const char *)(range+1))+range->variant;
            if(length>maxNameLength) {
                maxNameLength=length;
            }
            break;
        case 1: {
            /* name = prefix factorized-elements */
            const uint16_t *factors=(const uint16_t *)(range+1);
            const char *s;
            int32_t i, count=range->variant, factor, factorLength, maxFactorLength;

            /* prefix length */
            s=(const char *)(factors+count);
            length=calcStringSetLength(gNameSet, s);
            s+=length+1; /* start of factor suffixes */

            /* get the set and maximum factor suffix length for each factor */
            for(i=0; i<count; ++i) {
                maxFactorLength=0;
                for(factor=factors[i]; factor>0; --factor) {
                    factorLength=calcStringSetLength(gNameSet, s);
                    s+=factorLength+1;
                    if(factorLength>maxFactorLength) {
                        maxFactorLength=factorLength;
                    }
                }
                length+=maxFactorLength;
            }

            if(length>maxNameLength) {
                maxNameLength=length;
            }
            break;
        }
        default:
            /* unknown type */
            break;
        }

        range=(AlgorithmicRange *)((uint8_t *)range+range->size);
        --rangeCount;
    }
    return maxNameLength;
}